

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O1

EncodeParams *
cinemo::threading::divideWork
          (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,long numThreads
          )

{
  undefined8 *puVar1;
  pointer ppLVar2;
  iterator __position;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  int iVar8;
  long lVar9;
  LameWrapper **__args;
  long lVar10;
  vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *this;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = numThreads;
  uVar5 = SUB168(auVar3 * ZEXT816(0x28),0);
  uVar6 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x28),8) == 0) {
    uVar5 = uVar6;
  }
  plVar7 = (long *)operator_new__(uVar5);
  *plVar7 = numThreads;
  if (numThreads != 0) {
    lVar9 = 0;
    do {
      *(undefined2 *)((long)plVar7 + lVar9 + 0xc) = 0;
      *(undefined1 *)((long)plVar7 + lVar9 + 0xe) = 0;
      *(undefined4 *)((long)plVar7 + lVar9 + 0x10) = 3;
      puVar1 = (undefined8 *)((long)plVar7 + lVar9 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)plVar7 + lVar9 + 0x28) = 0;
      lVar9 = lVar9 + 0x28;
    } while (numThreads * 0x28 != lVar9);
  }
  if ((lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    iVar8 = 0;
    do {
      if (0 < numThreads) {
        uVar5 = (ulong)iVar8;
        iVar4 = (int)numThreads;
        lVar9 = uVar5 * 8;
        lVar10 = 0;
        this = (vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *)(plVar7 + 3);
        do {
          ppLVar2 = (lw->
                    super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(lw->
                            super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <=
              uVar5) {
            iVar4 = -(int)lVar10;
            break;
          }
          __args = (LameWrapper **)((long)ppLVar2 + lVar9);
          __position._M_current = *(LameWrapper ***)(this + 8);
          if (__position._M_current == *(LameWrapper ***)(this + 0x10)) {
            std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>::
            _M_realloc_insert<cinemo::LameWrapper*const&>(this,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(this + 8) = *(long *)(this + 8) + 8;
          }
          lVar10 = lVar10 + -1;
          lVar9 = lVar9 + 8;
          this = this + 0x28;
          uVar5 = uVar5 + 1;
        } while (-lVar10 != numThreads);
        iVar8 = iVar8 + iVar4;
      }
    } while ((ulong)(long)iVar8 <
             (ulong)((long)(lw->
                           super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(lw->
                           super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return (EncodeParams *)(plVar7 + 1);
}

Assistant:

static EncodeParams* divideWork(const vector<LameWrapper*>& lw,
                                      long numThreads) {
            EncodeParams* wp = new EncodeParams[numThreads];
            int ja = 0; //Jobs Assigned

            while (ja < lw.size()) {
                for (int i = 0; i < numThreads && ja < lw.size(); ++i) {
                    wp[i].works.push_back(lw[ja++]);
                }
            }

            return wp;
        }